

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O1

void __thiscall
soplex::
LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::add(LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,DataKey *newkey,
     number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
     *newlhs,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *newrowVector,
     number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
     *newrhs,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *newobj,int *newscaleExp)

{
  int iVar1;
  pointer pnVar2;
  int32_t iVar3;
  long lVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  pointer pnVar6;
  byte bVar7;
  
  bVar7 = 0;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,newkey,newrowVector);
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  if ((int)((ulong)((long)(this->left).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->left).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 7) < iVar1) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->left,iVar1,true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->right,
            (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thenum,true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->object,
            (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thenum,true);
    DataArray<int>::reSize
              (&this->scaleExp,
               (this->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).set.thenum);
  }
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar2 = (this->left).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = newlhs;
  pnVar6 = pnVar2 + (long)iVar1 + -1;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (pointer)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  pnVar2[(long)iVar1 + -1].m_backend.exp = (newlhs->m_backend).exp;
  pnVar2[(long)iVar1 + -1].m_backend.neg = (newlhs->m_backend).neg;
  iVar3 = (newlhs->m_backend).prec_elem;
  pnVar2[(long)iVar1 + -1].m_backend.fpclass = (newlhs->m_backend).fpclass;
  pnVar2[(long)iVar1 + -1].m_backend.prec_elem = iVar3;
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar2 = (this->right).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = newrhs;
  pnVar6 = pnVar2 + (long)iVar1 + -1;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (pointer)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  pnVar2[(long)iVar1 + -1].m_backend.exp = (newrhs->m_backend).exp;
  pnVar2[(long)iVar1 + -1].m_backend.neg = (newrhs->m_backend).neg;
  iVar3 = (newrhs->m_backend).prec_elem;
  pnVar2[(long)iVar1 + -1].m_backend.fpclass = (newrhs->m_backend).fpclass;
  pnVar2[(long)iVar1 + -1].m_backend.prec_elem = iVar3;
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar2 = (this->object).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = newobj;
  pnVar6 = pnVar2 + (long)iVar1 + -1;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (pointer)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  pnVar2[(long)iVar1 + -1].m_backend.exp = (newobj->m_backend).exp;
  pnVar2[(long)iVar1 + -1].m_backend.neg = (newobj->m_backend).neg;
  iVar3 = (newobj->m_backend).prec_elem;
  pnVar2[(long)iVar1 + -1].m_backend.fpclass = (newobj->m_backend).fpclass;
  pnVar2[(long)iVar1 + -1].m_backend.prec_elem = iVar3;
  (this->scaleExp).data
  [(long)(this->
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).set.thenum + -1] = *newscaleExp;
  return;
}

Assistant:

void add(DataKey& newkey, const R& newlhs, const SVectorBase<R>& newrowVector, const R& newrhs,
            const R& newobj = 0, const int& newscaleExp = 0)
   {
      SVSetBase<R>::add(newkey, newrowVector);

      if(num() > left.dim())
      {
         left.reDim(num());
         right.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      left[num() - 1] = newlhs;
      right[num() - 1] = newrhs;
      object[num() - 1] = newobj;
      scaleExp[num() - 1] = newscaleExp;
   }